

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstructionFolder::FoldInstruction(InstructionFolder *this,Instruction *inst)

{
  Op OVar1;
  undefined1 local_31;
  Instruction *folded_inst;
  bool modified;
  Instruction *inst_local;
  InstructionFolder *this_local;
  
  folded_inst._7_1_ = false;
  while( true ) {
    OVar1 = opt::Instruction::opcode(inst);
    local_31 = false;
    if (OVar1 != OpCopyObject) {
      local_31 = FoldInstructionInternal(this,inst);
    }
    if (local_31 == false) break;
    folded_inst._7_1_ = true;
  }
  return folded_inst._7_1_;
}

Assistant:

bool InstructionFolder::FoldInstruction(Instruction* inst) const {
  bool modified = false;
  Instruction* folded_inst(inst);
  while (folded_inst->opcode() != spv::Op::OpCopyObject &&
         FoldInstructionInternal(&*folded_inst)) {
    modified = true;
  }
  return modified;
}